

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

char * ctemplate::ExpandWithCacheIs
                 (TemplateCache *cache,string *filename,Strip strip,TemplateDictionary *dict,
                 PerExpandData *per_expand_data,bool expected)

{
  bool bVar1;
  long lVar2;
  char *__dest;
  char *__src;
  char *buf;
  TemplateString local_78;
  string local_58 [8];
  string outstring;
  bool expected_local;
  PerExpandData *per_expand_data_local;
  TemplateDictionary *dict_local;
  Strip strip_local;
  string *filename_local;
  TemplateCache *cache_local;
  
  std::__cxx11::string::string(local_58);
  TemplateString::TemplateString(&local_78,filename);
  bVar1 = TemplateCache::ExpandWithData
                    (cache,&local_78,strip,(TemplateDictionaryInterface *)dict,per_expand_data,
                     (string *)local_58);
  if (expected == bVar1) {
    lVar2 = std::__cxx11::string::size();
    __dest = (char *)operator_new__(lVar2 + 1);
    __src = (char *)std::__cxx11::string::c_str();
    strcpy(__dest,__src);
    std::__cxx11::string::~string(local_58);
    return __dest;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xba,
         "expected == cache->ExpandWithData(filename, strip, dict, per_expand_data, &outstring)");
  TemplateString::TemplateString((TemplateString *)&buf,filename);
  bVar1 = TemplateCache::ExpandWithData
                    (cache,(TemplateString *)&buf,strip,(TemplateDictionaryInterface *)dict,
                     per_expand_data,(string *)local_58);
  if (expected == bVar1) {
    exit(1);
  }
  __assert_fail("expected == cache->ExpandWithData(filename, strip, dict, per_expand_data, &outstring)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                ,0xba,
                "const char *ctemplate::ExpandWithCacheIs(TemplateCache *, const string &, Strip, const TemplateDictionary *, PerExpandData *, bool)"
               );
}

Assistant:

const char* ExpandWithCacheIs(TemplateCache* cache,
                              const string& filename, Strip strip,
                              const TemplateDictionary *dict,
                              PerExpandData* per_expand_data, bool expected) {
  string outstring;
  ASSERT(expected == cache->ExpandWithData(filename, strip, dict,
                                           per_expand_data, &outstring));


  char* buf = new char[outstring.size()+1];
  strcpy(buf, outstring.c_str());
  return buf;
}